

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O1

void __thiscall validation_layer::eventsChecker::eventsChecker(eventsChecker *this)

{
  iterator __position;
  long lVar1;
  int iVar2;
  char *__s2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  validationChecker *local_18;
  
  this->enableEvents = false;
  __s2 = getenv("ZEL_ENABLE_EVENTS_CHECKER");
  if ((__s2 == (char *)0x0) || (iVar2 = strcmp("0",__s2), iVar2 == 0)) {
    this->enableEvents = false;
    return;
  }
  iVar2 = strcmp("1",__s2);
  this->enableEvents = iVar2 == 0;
  if (iVar2 != 0) {
    return;
  }
  puVar3 = (undefined8 *)operator_new(0x80);
  *puVar3 = &PTR_zeInitPrologue_001fac70;
  xla::GraphCycles::GraphCycles((GraphCycles *)(puVar3 + 1));
  puVar3[2] = puVar3 + 8;
  puVar3[3] = 1;
  puVar3[4] = 0;
  puVar3[5] = 0;
  *(undefined4 *)(puVar3 + 6) = 0x3f800000;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = puVar3 + 0xf;
  puVar3[10] = 1;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *(undefined4 *)(puVar3 + 0xd) = 0x3f800000;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = &PTR_zesInitPrologue_001fb958;
  DAT_00201590 = (undefined8 *)operator_new(8);
  *DAT_00201590 = &PTR_zetModuleGetDebugInfoPrologue_001fc2e0;
  lVar1 = context;
  local_18 = (validationChecker *)&events_checker;
  __position._M_current = *(validationChecker ***)(context + 0xd38);
  events_checker = puVar3;
  DAT_00201588 = puVar4;
  if (__position._M_current != *(validationChecker ***)(context + 0xd40)) {
    *__position._M_current = (validationChecker *)&events_checker;
    *(long *)(lVar1 + 0xd38) = *(long *)(lVar1 + 0xd38) + 8;
    return;
  }
  std::
  vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
  ::_M_realloc_insert<validation_layer::validationChecker*>
            ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
              *)(context + 0xd30),__position,&local_18);
  return;
}

Assistant:

eventsChecker::eventsChecker() {

    enableEvents = getenv_tobool("ZEL_ENABLE_EVENTS_CHECKER");
    if (enableEvents) {
        eventsChecker::ZEeventsChecker *zeChecker = new eventsChecker::ZEeventsChecker;
        eventsChecker::ZESeventsChecker *zesChecker = new eventsChecker::ZESeventsChecker;
        eventsChecker::ZETeventsChecker *zetChecker = new eventsChecker::ZETeventsChecker;
        events_checker.zeValidation = zeChecker;
        events_checker.zesValidation = zesChecker;
        events_checker.zetValidation = zetChecker;

        validation_layer::context.validationHandlers.push_back(&events_checker);
    }
}